

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

Result __thiscall wabt::interp::Table::Fill(Table *this,Store *store,u32 offset,Ref ref,u32 size)

{
  pointer pRVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  Enum EVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  bVar4 = Store::HasValueType(store,ref,*(ValueType *)&(this->type_).super_ExternType.field_0xc);
  auVar3 = _DAT_0015ac30;
  auVar2 = _DAT_0015ac20;
  if (bVar4) {
    pRVar1 = (this->elements_).
             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = (long)(this->elements_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pRVar1 >> 3;
    uVar7 = (ulong)size;
    uVar9 = (ulong)offset;
    EVar5 = Error;
    if (uVar9 <= uVar6 - uVar7 && uVar7 <= uVar6) {
      if (size != 0) {
        uVar6 = uVar7 + 0x1fffffffffffffff & 0x1fffffffffffffff;
        auVar10._8_4_ = (int)uVar6;
        auVar10._0_8_ = uVar6;
        auVar10._12_4_ = (int)(uVar6 >> 0x20);
        lVar8 = 0;
        auVar10 = auVar10 ^ _DAT_0015ac30;
        do {
          auVar11._8_4_ = (int)lVar8;
          auVar11._0_8_ = lVar8;
          auVar11._12_4_ = (int)((ulong)lVar8 >> 0x20);
          auVar11 = (auVar11 | auVar2) ^ auVar3;
          if ((bool)(~(auVar11._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar11._0_4_ ||
                      auVar10._4_4_ < auVar11._4_4_) & 1)) {
            pRVar1[uVar9 + lVar8].index = ref.index;
          }
          if ((auVar11._12_4_ != auVar10._12_4_ || auVar11._8_4_ <= auVar10._8_4_) &&
              auVar11._12_4_ <= auVar10._12_4_) {
            pRVar1[uVar9 + lVar8 + 1].index = ref.index;
          }
          lVar8 = lVar8 + 2;
        } while ((uVar6 - ((uint)(uVar7 + 0x1fffffffffffffff) & 1)) + 2 != lVar8);
      }
      EVar5 = Ok;
    }
    return (Result)EVar5;
  }
  __assert_fail("store.HasValueType(ref, type_.element)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp.cc"
                ,0x216,"Result wabt::interp::Table::Fill(Store &, u32, Ref, u32)");
}

Assistant:

Result Table::Fill(Store& store, u32 offset, Ref ref, u32 size) {
  assert(store.HasValueType(ref, type_.element));
  if (IsValidRange(offset, size)) {
    std::fill(elements_.begin() + offset, elements_.begin() + offset + size,
              ref);
    return Result::Ok;
  }
  return Result::Error;
}